

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcUtil.c
# Opt level: O0

Abc_Ntk_t * Abc_NtkDeriveWithOnePo(Abc_Ntk_t *pNtk,Vec_Int_t *vNodeIds,Vec_Int_t *vNodeValues)

{
  int iVar1;
  int iVar2;
  Vec_Ptr_t *p;
  Abc_Ntk_t *pNtk_00;
  char *pcVar3;
  Abc_Obj_t *pAVar4;
  Abc_Obj_t *pAVar5;
  int Value;
  int Id;
  int k;
  int i;
  Vec_Ptr_t *vFanins;
  Abc_Obj_t *pOutputNew;
  Abc_Obj_t *pObjNew;
  Abc_Obj_t *pFanin;
  Abc_Obj_t *pObj;
  Abc_Ntk_t *pNtkNew;
  int fCopyNames;
  Vec_Int_t *vNodeValues_local;
  Vec_Int_t *vNodeIds_local;
  Abc_Ntk_t *pNtk_local;
  
  p = Vec_PtrAlloc(100);
  pNtk_00 = Abc_NtkAlloc(pNtk->ntkType,pNtk->ntkFunc,1);
  pcVar3 = Extra_UtilStrsav(pNtk->pName);
  pNtk_00->pName = pcVar3;
  pcVar3 = Extra_UtilStrsav(pNtk->pSpec);
  pNtk_00->pSpec = pcVar3;
  Abc_NtkCleanCopy(pNtk);
  iVar1 = Abc_NtkIsStrash(pNtk);
  if ((iVar1 != 0) && (iVar1 = Abc_NtkIsStrash(pNtk_00), iVar1 != 0)) {
    pAVar4 = Abc_AigConst1(pNtk_00);
    pAVar5 = Abc_AigConst1(pNtk);
    (pAVar5->field_6).pCopy = pAVar4;
  }
  for (Id = 0; iVar1 = Abc_NtkPiNum(pNtk), Id < iVar1; Id = Id + 1) {
    pAVar4 = Abc_NtkPi(pNtk,Id);
    Abc_NtkDupObj(pNtk_00,pAVar4,1);
  }
  pAVar4 = Abc_NtkCreateObj(pNtk_00,ABC_OBJ_PO);
  Abc_ObjAssignName(pAVar4,"monitor",(char *)0x0);
  for (Id = 0; iVar1 = Vec_PtrSize(pNtk->vBoxes), Id < iVar1; Id = Id + 1) {
    pAVar4 = Abc_NtkBox(pNtk,Id);
    Abc_NtkDupBox(pNtk_00,pAVar4,1);
  }
  for (Id = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Id < iVar1; Id = Id + 1) {
    pAVar4 = Abc_NtkObj(pNtk,Id);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && ((pAVar4->field_6).pTemp == (void *)0x0)) &&
       (iVar1 = Abc_ObjIsPo(pAVar4), iVar1 == 0)) {
      Abc_NtkDupObj(pNtk_00,pAVar4,0);
    }
  }
  for (Id = 0; iVar1 = Vec_PtrSize(pNtk->vObjs), Id < iVar1; Id = Id + 1) {
    pAVar4 = Abc_NtkObj(pNtk,Id);
    if (((pAVar4 != (Abc_Obj_t *)0x0) && (iVar1 = Abc_ObjIsPo(pAVar4), iVar1 == 0)) &&
       ((iVar1 = Abc_ObjIsBox(pAVar4), iVar1 == 0 && (iVar1 = Abc_ObjIsBo(pAVar4), iVar1 == 0)))) {
      for (Value = 0; iVar1 = Abc_ObjFaninNum(pAVar4), Value < iVar1; Value = Value + 1) {
        pAVar5 = Abc_ObjFanin(pAVar4,Value);
        Abc_ObjAddFanin((pAVar4->field_6).pCopy,(pAVar5->field_6).pCopy);
      }
    }
  }
  vFanins = (Vec_Ptr_t *)0x0;
  for (Id = 0; iVar1 = Vec_IntSize(vNodeIds), Id < iVar1; Id = Id + 1) {
    iVar1 = Vec_IntEntry(vNodeIds,Id);
    iVar2 = Vec_IntEntry(vNodeValues,Id);
    pAVar4 = Abc_NtkObj(pNtk,iVar1);
    pOutputNew = (pAVar4->field_6).pCopy;
    if (iVar2 == 0) {
      pOutputNew = Abc_NtkCreateNodeInv(pNtk_00,pOutputNew);
    }
    if (vFanins == (Vec_Ptr_t *)0x0) {
      vFanins = (Vec_Ptr_t *)pOutputNew;
    }
    else {
      Vec_PtrFillTwo(p,2,vFanins,pOutputNew);
      vFanins = (Vec_Ptr_t *)Abc_NtkCreateNodeAnd(pNtk_00,p);
    }
  }
  Vec_PtrFree(p);
  pAVar4 = Abc_NtkPo(pNtk_00,0);
  Abc_ObjAddFanin(pAVar4,(Abc_Obj_t *)vFanins);
  iVar1 = Abc_NtkPoNum(pNtk_00);
  if (iVar1 != 1) {
    __assert_fail("Abc_NtkPoNum(pNtkNew) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                  ,0xbbe,"Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)")
    ;
  }
  iVar1 = Abc_NtkCiNum(pNtk_00);
  iVar2 = Abc_NtkCiNum(pNtk);
  if (iVar1 != iVar2) {
    __assert_fail("Abc_NtkCiNum(pNtkNew) == Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                  ,0xbbf,"Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)")
    ;
  }
  iVar1 = Abc_NtkLatchNum(pNtk_00);
  iVar2 = Abc_NtkLatchNum(pNtk);
  if (iVar1 == iVar2) {
    return pNtk_00;
  }
  __assert_fail("Abc_NtkLatchNum(pNtkNew) == Abc_NtkLatchNum(pNtk)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abc/abcUtil.c"
                ,0xbc0,"Abc_Ntk_t *Abc_NtkDeriveWithOnePo(Abc_Ntk_t *, Vec_Int_t *, Vec_Int_t *)");
}

Assistant:

Abc_Ntk_t * Abc_NtkDeriveWithOnePo( Abc_Ntk_t * pNtk, Vec_Int_t * vNodeIds, Vec_Int_t * vNodeValues )
{
    int fCopyNames = 1;
    Abc_Ntk_t * pNtkNew; 
    Abc_Obj_t * pObj, * pFanin, * pObjNew, * pOutputNew;
    Vec_Ptr_t * vFanins = Vec_PtrAlloc( 100 );
    int i, k, Id, Value;
    // start the network
    pNtkNew = Abc_NtkAlloc( pNtk->ntkType, pNtk->ntkFunc, 1 );
    // duplicate the name and the spec
    pNtkNew->pName = Extra_UtilStrsav(pNtk->pName);
    pNtkNew->pSpec = Extra_UtilStrsav(pNtk->pSpec);
    // clean the node copy fields
    Abc_NtkCleanCopy( pNtk );
    // map the constant nodes
    if ( Abc_NtkIsStrash(pNtk) && Abc_NtkIsStrash(pNtkNew) )
        Abc_AigConst1(pNtk)->pCopy = Abc_AigConst1(pNtkNew);
    // clone CIs/CIs/boxes
    Abc_NtkForEachPi( pNtk, pObj, i )
        Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    //Abc_NtkForEachPo( pNtk, pObj, i )
    //    Abc_NtkDupObj( pNtkNew, pObj, fCopyNames );
    // create one PO
    pObjNew = Abc_NtkCreateObj( pNtkNew, ABC_OBJ_PO );
    Abc_ObjAssignName( pObjNew, "monitor", NULL );
    // create boxes
    Abc_NtkForEachBox( pNtk, pObj, i )
        Abc_NtkDupBox( pNtkNew, pObj, fCopyNames );

    // duplicate nodes (CIs/COs/latches are already duplicated)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( pObj->pCopy == NULL && !Abc_ObjIsPo(pObj) )
            Abc_NtkDupObj(pNtkNew, pObj, 0);
    // reconnect all objects except boxes (they are already connected) and POs (they will be connected later)
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( !Abc_ObjIsPo(pObj) && !Abc_ObjIsBox(pObj) && !Abc_ObjIsBo(pObj) )
            Abc_ObjForEachFanin( pObj, pFanin, k )
                Abc_ObjAddFanin( pObj->pCopy, pFanin->pCopy );

    // AND nodes (with interters if needed)
    pOutputNew = NULL;
    Vec_IntForEachEntryTwo( vNodeIds, vNodeValues, Id, Value, i )
    {
        pObjNew = Abc_NtkObj( pNtk, Id )->pCopy;
        if ( Value == 0 ) // negative polarity - add inverter
            pObjNew = Abc_NtkCreateNodeInv( pNtkNew, pObjNew );
        if ( pOutputNew == NULL )
            pOutputNew = pObjNew;
        else
        {
            Vec_PtrFillTwo( vFanins, 2, pOutputNew, pObjNew );
            pOutputNew = Abc_NtkCreateNodeAnd( pNtkNew, vFanins );
        }
    }
    Vec_PtrFree( vFanins );
    // create the only POs, which is the AND of the corresponding nodes
    Abc_ObjAddFanin( Abc_NtkPo(pNtkNew, 0), pOutputNew );

    // check that the CI/CO/latches are copied correctly
    assert( Abc_NtkPoNum(pNtkNew)    == 1 );
    assert( Abc_NtkCiNum(pNtkNew)    == Abc_NtkCiNum(pNtk) );
    assert( Abc_NtkLatchNum(pNtkNew) == Abc_NtkLatchNum(pNtk) );
    return pNtkNew;
}